

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode eyeballer_new(eyeballer **pballer,cf_ip_connect_create *cf_create,Curl_addrinfo *addr,
                      int ai_family,eyeballer *primary,timediff_t delay_ms,timediff_t timeout_ms,
                      expire_id timeout_id)

{
  eyeballer *peVar1;
  Curl_addrinfo *pCVar2;
  long local_60;
  long local_58;
  char *local_50;
  eyeballer *baller;
  timediff_t delay_ms_local;
  eyeballer *primary_local;
  int ai_family_local;
  Curl_addrinfo *addr_local;
  cf_ip_connect_create *cf_create_local;
  eyeballer **pballer_local;
  
  *pballer = (eyeballer *)0x0;
  peVar1 = (eyeballer *)(*Curl_ccalloc)(1,0x68);
  if (peVar1 == (eyeballer *)0x0) {
    pballer_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    if (ai_family == 2) {
      local_50 = "ipv4";
    }
    else {
      local_50 = "ip";
      if (ai_family == 10) {
        local_50 = "ipv6";
      }
    }
    peVar1->name = local_50;
    peVar1->cf_create = cf_create;
    peVar1->addr = addr;
    peVar1->first = addr;
    peVar1->ai_family = ai_family;
    peVar1->primary = primary;
    peVar1->delay_ms = delay_ms;
    pCVar2 = addr_next_match(peVar1->addr,peVar1->ai_family);
    if (pCVar2 == (Curl_addrinfo *)0x0) {
      local_60 = timeout_ms;
    }
    else {
      if (timeout_ms < 0x259) {
        local_58 = timeout_ms;
      }
      else {
        local_58 = timeout_ms / 2;
      }
      local_60 = local_58;
    }
    peVar1->timeoutms = local_60;
    peVar1->timeout_id = timeout_id;
    peVar1->result = CURLE_COULDNT_CONNECT;
    *pballer = peVar1;
    pballer_local._4_4_ = CURLE_OK;
  }
  return pballer_local._4_4_;
}

Assistant:

static CURLcode eyeballer_new(struct eyeballer **pballer,
                              cf_ip_connect_create *cf_create,
                              const struct Curl_addrinfo *addr,
                              int ai_family,
                              struct eyeballer *primary,
                              timediff_t delay_ms,
                              timediff_t timeout_ms,
                              expire_id timeout_id)
{
  struct eyeballer *baller;

  *pballer = NULL;
  baller = calloc(1, sizeof(*baller));
  if(!baller)
    return CURLE_OUT_OF_MEMORY;

  baller->name = ((ai_family == AF_INET) ? "ipv4" : (
#ifdef USE_IPV6
                  (ai_family == AF_INET6) ? "ipv6" :
#endif
                  "ip"));
  baller->cf_create = cf_create;
  baller->first = baller->addr = addr;
  baller->ai_family = ai_family;
  baller->primary = primary;
  baller->delay_ms = delay_ms;
  baller->timeoutms = addr_next_match(baller->addr, baller->ai_family) ?
    USETIME(timeout_ms) : timeout_ms;
  baller->timeout_id = timeout_id;
  baller->result = CURLE_COULDNT_CONNECT;

  *pballer = baller;
  return CURLE_OK;
}